

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O3

void libcellml::buildMaps
               (ComponentEntityPtr *componentEntity,ComponentMap *componentMap,
               VariableMap *variableMap)

{
  size_t sVar1;
  ulong uVar2;
  ComponentPtr component;
  ComponentEntityPtr local_50;
  ComponentEntity local_40;
  
  sVar1 = ComponentEntity::componentCount
                    ((componentEntity->
                     super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
  if (sVar1 != 0) {
    uVar2 = 0;
    do {
      ComponentEntity::component
                (&local_40,
                 (size_t)(componentEntity->
                         super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr);
      buildMapsForComponentsVariables((ComponentPtr *)&local_40,componentMap,variableMap);
      local_50.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_40.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity
      ;
      local_50.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)
           ((long)local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) =
               *(_Atomic_word *)
                ((long)local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)
           ((long)local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) =
               *(_Atomic_word *)
                ((long)local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) + 1;
        }
      }
      buildMaps(&local_50,componentMap,variableMap);
      if (local_50.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.
                   super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
      }
      uVar2 = uVar2 + 1;
      sVar1 = ComponentEntity::componentCount
                        ((componentEntity->
                         super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr);
    } while (uVar2 < sVar1);
  }
  return;
}

Assistant:

void buildMaps(const ComponentEntityPtr &componentEntity, ComponentMap &componentMap, VariableMap &variableMap)
{
    for (size_t i = 0; i < componentEntity->componentCount(); ++i) {
        ComponentPtr component = componentEntity->component(i);
        buildMapsForComponentsVariables(component, componentMap, variableMap);
        buildMaps(component, componentMap, variableMap);
    }
}